

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool useSpecialFloats;
  UInt UVar3;
  int iVar4;
  undefined1 *puVar5;
  Value *pVVar6;
  BuiltStyledStreamWriter *this_00;
  char *pcVar7;
  uint precision;
  Enum cs;
  Value *pVVar8;
  string colonSymbol;
  string nullSymbol;
  string endingLineFeedSymbol;
  string cs_str;
  string indentation;
  
  pVVar8 = &this->settings_;
  puVar5 = (undefined1 *)Value::find(pVVar8,"indentation","");
  if ((Value *)puVar5 == (Value *)0x0) {
    puVar5 = kNull;
  }
  Value::asString_abi_cxx11_(&indentation,(Value *)puVar5);
  puVar5 = (undefined1 *)Value::find(pVVar8,"commentStyle","");
  if ((Value *)puVar5 == (Value *)0x0) {
    puVar5 = kNull;
  }
  Value::asString_abi_cxx11_(&cs_str,(Value *)puVar5);
  puVar5 = (undefined1 *)Value::find(pVVar8,"enableYAMLCompatibility","");
  if ((Value *)puVar5 == (Value *)0x0) {
    puVar5 = kNull;
  }
  bVar1 = Value::asBool((Value *)puVar5);
  puVar5 = (undefined1 *)Value::find(pVVar8,"dropNullPlaceholders","");
  if ((Value *)puVar5 == (Value *)0x0) {
    puVar5 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar5);
  puVar5 = (undefined1 *)Value::find(pVVar8,"useSpecialFloats","");
  if ((Value *)puVar5 == (Value *)0x0) {
    puVar5 = kNull;
  }
  useSpecialFloats = Value::asBool((Value *)puVar5);
  pVVar6 = Value::find(pVVar8,"precision","");
  pVVar8 = (Value *)kNull;
  if (pVVar6 != (Value *)0x0) {
    pVVar8 = pVVar6;
  }
  UVar3 = Value::asUInt(pVVar8);
  iVar4 = std::__cxx11::string::compare((char *)&cs_str);
  if (iVar4 == 0) {
    cs = All;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&cs_str);
    cs = None;
    if (iVar4 != 0) {
      colonSymbol._M_dataplus._M_p = (pointer)&colonSymbol.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colonSymbol,"commentStyle must be \'All\' or \'None\'","");
      throwRuntimeError(&colonSymbol);
    }
  }
  colonSymbol._M_dataplus._M_p = (pointer)&colonSymbol.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colonSymbol," : ","");
  if (bVar1) {
    pcVar7 = ": ";
  }
  else {
    if (indentation._M_string_length != 0) goto LAB_0011b071;
    pcVar7 = ":";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&colonSymbol,0,(char *)colonSymbol._M_string_length,(ulong)pcVar7);
LAB_0011b071:
  nullSymbol._M_dataplus._M_p = (pointer)&nullSymbol.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nullSymbol,"null","");
  if (bVar2) {
    std::__cxx11::string::_M_replace
              ((ulong)&nullSymbol,0,(char *)nullSymbol._M_string_length,0x122aed);
  }
  precision = 0x11;
  if (UVar3 < 0x11) {
    precision = UVar3;
  }
  endingLineFeedSymbol._M_dataplus._M_p = (pointer)&endingLineFeedSymbol.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&endingLineFeedSymbol,"");
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe0);
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&indentation,cs,&colonSymbol,&nullSymbol,&endingLineFeedSymbol,useSpecialFloats
             ,precision);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)endingLineFeedSymbol._M_dataplus._M_p != &endingLineFeedSymbol.field_2) {
    operator_delete(endingLineFeedSymbol._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nullSymbol._M_dataplus._M_p != &nullSymbol.field_2) {
    operator_delete(nullSymbol._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colonSymbol._M_dataplus._M_p != &colonSymbol.field_2) {
    operator_delete(colonSymbol._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cs_str._M_dataplus._M_p != &cs_str.field_2) {
    operator_delete(cs_str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)indentation._M_dataplus._M_p != &indentation.field_2) {
    operator_delete(indentation._M_dataplus._M_p);
  }
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const
{
  JSONCPP_STRING indentation = settings_["indentation"].asString();
  JSONCPP_STRING cs_str = settings_["commentStyle"].asString();
  bool eyc = settings_["enableYAMLCompatibility"].asBool();
  bool dnp = settings_["dropNullPlaceholders"].asBool();
  bool usf = settings_["useSpecialFloats"].asBool(); 
  unsigned int pre = settings_["precision"].asUInt();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  JSONCPP_STRING colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  JSONCPP_STRING nullSymbol = "null";
  if (dnp) {
    nullSymbol = "";
  }
  if (pre > 17) pre = 17;
  JSONCPP_STRING endingLineFeedSymbol = "";
  return new BuiltStyledStreamWriter(
      indentation, cs,
      colonSymbol, nullSymbol, endingLineFeedSymbol, usf, pre);
}